

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersector1<4,_16777232,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  byte bVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  size_t i;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  long local_fa8;
  ulong local_fa0;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar1 = (context->query_radius).field_0.m128[0];
  auVar27 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1008 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_1008 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar21 = (undefined1 (*) [16])local_f68;
  uVar15 = *(undefined4 *)&(query->p).field_0;
  local_fd8._4_4_ = uVar15;
  local_fd8._0_4_ = uVar15;
  local_fd8._8_4_ = uVar15;
  local_fd8._12_4_ = uVar15;
  auVar36 = ZEXT1664(local_fd8);
  local_fb8 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  local_fc8 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  local_f88 = (context->query_radius).field_0.m128[1];
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  local_f98 = (context->query_radius).field_0.m128[2];
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  fVar1 = fVar1 * fVar1;
  auVar25._4_4_ = fVar1;
  auVar25._0_4_ = fVar1;
  auVar25._8_4_ = fVar1;
  auVar25._12_4_ = fVar1;
  bVar14 = false;
LAB_0192efd1:
  local_ff8 = auVar27._0_16_;
  local_fe8 = vsubps_avx(auVar36._0_16_,local_ff8);
  auVar26._0_4_ = auVar36._0_4_ + auVar27._0_4_;
  auVar26._4_4_ = auVar36._4_4_ + auVar27._4_4_;
  auVar26._8_4_ = auVar36._8_4_ + auVar27._8_4_;
  auVar26._12_4_ = auVar36._12_4_ + auVar27._12_4_;
  auVar6._4_4_ = fStack_fb4;
  auVar6._0_4_ = local_fb8;
  auVar6._8_4_ = fStack_fb0;
  auVar6._12_4_ = fStack_fac;
  auVar5._4_4_ = fStack_f84;
  auVar5._0_4_ = local_f88;
  auVar5._8_4_ = fStack_f80;
  auVar5._12_4_ = fStack_f7c;
  auVar6 = vsubps_avx(auVar6,auVar5);
  auVar28._0_4_ = local_fb8 + local_f88;
  auVar28._4_4_ = fStack_fb4 + fStack_f84;
  auVar28._8_4_ = fStack_fb0 + fStack_f80;
  auVar28._12_4_ = fStack_fac + fStack_f7c;
  auVar7._4_4_ = fStack_fc4;
  auVar7._0_4_ = local_fc8;
  auVar7._8_4_ = fStack_fc0;
  auVar7._12_4_ = fStack_fbc;
  auVar31._4_4_ = fStack_f94;
  auVar31._0_4_ = local_f98;
  auVar31._8_4_ = fStack_f90;
  auVar31._12_4_ = fStack_f8c;
  auVar7 = vsubps_avx(auVar7,auVar31);
  auVar29._0_4_ = local_fc8 + local_f98;
  auVar29._4_4_ = fStack_fc4 + fStack_f94;
  auVar29._8_4_ = fStack_fc0 + fStack_f90;
  auVar29._12_4_ = fStack_fbc + fStack_f8c;
  while( true ) {
    pauVar12 = pauVar21 + -1;
    pauVar21 = pauVar21 + -1;
    if ((float)local_1008._0_4_ < *(float *)(*pauVar12 + 8)) break;
    uVar17 = *(ulong *)*pauVar21;
LAB_0192f02e:
    uVar18 = (uint)uVar17;
    auVar31 = auVar36._0_16_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar17 & 8) != 0) {
LAB_0192f48b:
        local_fa8 = (ulong)(uVar18 & 0xf) - 8;
        if (local_fa8 == 0) break;
        lVar23 = (uVar17 & 0xfffffffffffffff0) + 0x50;
        lVar24 = 0;
        uVar17 = 0;
        goto LAB_0192f4af;
      }
      uVar16 = uVar17 & 0xfffffffffffffff0;
      fVar1 = query->time;
      auVar30._4_4_ = fVar1;
      auVar30._0_4_ = fVar1;
      auVar30._8_4_ = fVar1;
      auVar30._12_4_ = fVar1;
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x20));
      auVar8 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0),auVar30,
                               *(undefined1 (*) [16])(uVar16 + 0x40));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xc0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x60));
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x90),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x30));
      auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xb0),auVar30,
                               *(undefined1 (*) [16])(uVar16 + 0x50));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xd0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x70));
      auVar5 = vmaxps_avx(auVar31,auVar32);
      auVar5 = vminps_avx(auVar5,auVar34);
      auVar5 = vsubps_avx(auVar5,auVar31);
      auVar10._4_4_ = fStack_fb4;
      auVar10._0_4_ = local_fb8;
      auVar10._8_4_ = fStack_fb0;
      auVar10._12_4_ = fStack_fac;
      auVar31 = vmaxps_avx(auVar10,auVar8);
      auVar31 = vminps_avx(auVar31,auVar9);
      auVar8 = vsubps_avx(auVar31,auVar10);
      auVar9._4_4_ = fStack_fc4;
      auVar9._0_4_ = local_fc8;
      auVar9._8_4_ = fStack_fc0;
      auVar9._12_4_ = fStack_fbc;
      auVar31 = vmaxps_avx(auVar9,auVar33);
      auVar31 = vminps_avx(auVar31,auVar35);
      auVar31 = vsubps_avx(auVar31,auVar9);
      local_1018._0_4_ =
           auVar5._0_4_ * auVar5._0_4_ + auVar8._0_4_ * auVar8._0_4_ + auVar31._0_4_ * auVar31._0_4_
      ;
      local_1018._4_4_ =
           auVar5._4_4_ * auVar5._4_4_ + auVar8._4_4_ * auVar8._4_4_ + auVar31._4_4_ * auVar31._4_4_
      ;
      fStack_1010 = auVar5._8_4_ * auVar5._8_4_ + auVar8._8_4_ * auVar8._8_4_ +
                    auVar31._8_4_ * auVar31._8_4_;
      fStack_100c = auVar5._12_4_ * auVar5._12_4_ + auVar8._12_4_ * auVar8._12_4_ +
                    auVar31._12_4_ * auVar31._12_4_;
      auVar31 = vcmpps_avx(_local_1018,auVar25,2);
      auVar5 = vcmpps_avx(auVar32,auVar34,2);
      auVar31 = vandps_avx(auVar31,auVar5);
      if ((uVar18 & 7) == 6) {
LAB_0192f2e3:
        uVar16 = uVar17 & 0xfffffffffffffff0;
        auVar5 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar30,2);
        auVar8 = vcmpps_avx(auVar30,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
        auVar5 = vandps_avx(auVar5,auVar8);
        auVar31 = vandps_avx(auVar31,auVar5);
        auVar31 = vpslld_avx(auVar31,0x1f);
        uVar15 = vmovmskps_avx(auVar31);
        uVar16 = CONCAT44((int)(uVar16 >> 0x20),uVar15);
      }
      else {
        uVar15 = vmovmskps_avx(auVar31);
        uVar16 = CONCAT44((int)(uVar16 >> 0x20),uVar15);
      }
    }
    else {
      if ((uVar17 & 8) != 0) goto LAB_0192f48b;
      uVar16 = uVar17 & 0xfffffffffffffff0;
      fVar1 = query->time;
      auVar30._4_4_ = fVar1;
      auVar30._0_4_ = fVar1;
      auVar30._8_4_ = fVar1;
      auVar30._12_4_ = fVar1;
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x20));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x40));
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xc0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x60));
      auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x90),auVar30,
                               *(undefined1 (*) [16])(uVar16 + 0x30));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xb0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x50));
      auVar10 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xd0),auVar30,
                                *(undefined1 (*) [16])(uVar16 + 0x70));
      auVar5 = vmaxps_avx(auVar31,auVar32);
      auVar5 = vminps_avx(auVar5,auVar9);
      auVar5 = vsubps_avx(auVar5,auVar31);
      auVar8._4_4_ = fStack_fb4;
      auVar8._0_4_ = local_fb8;
      auVar8._8_4_ = fStack_fb0;
      auVar8._12_4_ = fStack_fac;
      auVar31 = vmaxps_avx(auVar8,auVar33);
      auVar31 = vminps_avx(auVar31,auVar35);
      auVar8 = vsubps_avx(auVar31,auVar8);
      auVar11._4_4_ = fStack_fc4;
      auVar11._0_4_ = local_fc8;
      auVar11._8_4_ = fStack_fc0;
      auVar11._12_4_ = fStack_fbc;
      auVar31 = vmaxps_avx(auVar11,auVar34);
      auVar31 = vminps_avx(auVar31,auVar10);
      auVar31 = vsubps_avx(auVar31,auVar11);
      local_1018._4_4_ =
           auVar5._4_4_ * auVar5._4_4_ + auVar8._4_4_ * auVar8._4_4_ + auVar31._4_4_ * auVar31._4_4_
      ;
      local_1018._0_4_ =
           auVar5._0_4_ * auVar5._0_4_ + auVar8._0_4_ * auVar8._0_4_ + auVar31._0_4_ * auVar31._0_4_
      ;
      fStack_1010 = auVar5._8_4_ * auVar5._8_4_ + auVar8._8_4_ * auVar8._8_4_ +
                    auVar31._8_4_ * auVar31._8_4_;
      fStack_100c = auVar5._12_4_ * auVar5._12_4_ + auVar8._12_4_ * auVar8._12_4_ +
                    auVar31._12_4_ * auVar31._12_4_;
      auVar31 = vcmpps_avx(auVar32,auVar9,2);
      auVar5 = vcmpps_avx(auVar35,auVar6,5);
      auVar31 = vandps_avx(auVar31,auVar5);
      auVar5 = vcmpps_avx(auVar32,auVar26,2);
      auVar8 = vcmpps_avx(auVar33,auVar28,2);
      auVar5 = vandps_avx(auVar8,auVar5);
      auVar8 = vcmpps_avx(auVar10,auVar7,5);
      auVar31 = vandps_avx(auVar31,auVar8);
      auVar8 = vcmpps_avx(auVar9,local_fe8,5);
      auVar32 = vcmpps_avx(auVar34,auVar29,2);
      auVar8 = vandps_avx(auVar32,auVar8);
      auVar5 = vandps_avx(auVar5,auVar8);
      auVar31 = vandps_avx(auVar5,auVar31);
      if ((uVar18 & 7) == 6) {
        auVar36 = ZEXT1664(local_fd8);
        goto LAB_0192f2e3;
      }
      auVar31 = vpslld_avx(auVar31,0x1f);
      uVar15 = vmovmskps_avx(auVar31);
      uVar16 = CONCAT44((int)(uVar16 >> 0x20),uVar15);
      auVar36 = ZEXT1664(local_fd8);
    }
    if (uVar16 != 0) {
      uVar22 = uVar17 & 0xfffffffffffffff0;
      lVar24 = 0;
      for (uVar17 = uVar16; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar18 = (uint)uVar16 - 1 & (uint)uVar16;
      uVar16 = (ulong)uVar18;
      uVar17 = *(ulong *)(uVar22 + lVar24 * 8);
      if (uVar18 != 0) {
        uVar3 = *(uint *)(local_1018 + lVar24 * 4);
        lVar24 = 0;
        for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar24 = lVar24 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar20 = (ulong)uVar18;
        uVar16 = *(ulong *)(uVar22 + lVar24 * 8);
        uVar4 = *(uint *)(local_1018 + lVar24 * 4);
        if (uVar18 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar21 = uVar16;
            *(uint *)(*pauVar21 + 8) = uVar4;
            pauVar21 = pauVar21 + 1;
          }
          else {
            *(ulong *)*pauVar21 = uVar17;
            *(uint *)(*pauVar21 + 8) = uVar3;
            pauVar21 = pauVar21 + 1;
            uVar17 = uVar16;
          }
        }
        else {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar17;
          auVar31 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar3));
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar16;
          auVar5 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar4));
          lVar24 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar17 = (ulong)uVar18;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(uVar22 + lVar24 * 8);
          auVar32 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_1018 + lVar24 * 4)));
          auVar8 = vpcmpgtd_avx(auVar5,auVar31);
          if (uVar18 == 0) {
            auVar33 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar5,auVar31,auVar33);
            auVar31 = vblendvps_avx(auVar31,auVar5,auVar33);
            auVar5 = vpcmpgtd_avx(auVar32,auVar8);
            auVar33 = vpshufd_avx(auVar5,0xaa);
            auVar5 = vblendvps_avx(auVar32,auVar8,auVar33);
            auVar8 = vblendvps_avx(auVar8,auVar32,auVar33);
            auVar32 = vpcmpgtd_avx(auVar8,auVar31);
            auVar33 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar8,auVar31,auVar33);
            auVar31 = vblendvps_avx(auVar31,auVar8,auVar33);
            *pauVar21 = auVar31;
            pauVar21[1] = auVar32;
            uVar17 = auVar5._0_8_;
            pauVar21 = pauVar21 + 2;
          }
          else {
            lVar24 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar24 = lVar24 + 1;
            }
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)(uVar22 + lVar24 * 8);
            auVar34 = vpunpcklqdq_avx(auVar35,ZEXT416(*(uint *)(local_1018 + lVar24 * 4)));
            auVar33 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar5,auVar31,auVar33);
            auVar31 = vblendvps_avx(auVar31,auVar5,auVar33);
            auVar5 = vpcmpgtd_avx(auVar34,auVar32);
            auVar33 = vpshufd_avx(auVar5,0xaa);
            auVar5 = vblendvps_avx(auVar34,auVar32,auVar33);
            auVar32 = vblendvps_avx(auVar32,auVar34,auVar33);
            auVar33 = vpcmpgtd_avx(auVar32,auVar31);
            auVar34 = vpshufd_avx(auVar33,0xaa);
            auVar33 = vblendvps_avx(auVar32,auVar31,auVar34);
            auVar31 = vblendvps_avx(auVar31,auVar32,auVar34);
            auVar32 = vpcmpgtd_avx(auVar5,auVar8);
            auVar34 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar5,auVar8,auVar34);
            auVar5 = vblendvps_avx(auVar8,auVar5,auVar34);
            auVar8 = vpcmpgtd_avx(auVar33,auVar5);
            auVar34 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar33,auVar5,auVar34);
            auVar5 = vblendvps_avx(auVar5,auVar33,auVar34);
            *pauVar21 = auVar31;
            pauVar21[1] = auVar5;
            pauVar21[2] = auVar8;
            uVar17 = auVar32._0_8_;
            pauVar21 = pauVar21 + 3;
          }
        }
      }
      goto LAB_0192f02e;
    }
    if (pauVar21 == (undefined1 (*) [16])&local_f78) {
      return bVar14;
    }
  }
  auVar27 = ZEXT1664(local_ff8);
  goto LAB_0192f597;
LAB_0192f4af:
  do {
    local_fa0 = uVar17;
    local_fe8._0_8_ = lVar24;
    bVar19 = 0;
    lVar24 = 0;
    do {
      if (*(int *)(lVar23 + lVar24 * 4) == -1) break;
      uVar18 = *(uint *)(lVar23 + -0x10 + lVar24 * 4);
      this = (context->scene->geometries).items[uVar18].ptr;
      context->geomID = uVar18;
      context->primID = *(uint *)(lVar23 + lVar24 * 4);
      bVar13 = Geometry::pointQuery(this,query,context);
      auVar36 = ZEXT1664(local_fd8);
      bVar19 = bVar19 | bVar13;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 4);
    uVar17 = CONCAT71((int7)(local_fa0 >> 8),(byte)local_fa0 | bVar19);
    lVar24 = local_fe8._0_8_ + 1;
    lVar23 = lVar23 + 0x60;
  } while (lVar24 != local_fa8);
  if ((local_fa0 & 1) == 0 && bVar19 == 0) {
    auVar27 = ZEXT1664(local_ff8);
  }
  else {
    uVar15 = *(undefined4 *)&(context->query_radius).field_0;
    auVar27 = ZEXT1664(CONCAT412(uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))));
    local_f88 = (context->query_radius).field_0.m128[1];
    fStack_f84 = local_f88;
    fStack_f80 = local_f88;
    fStack_f7c = local_f88;
    local_f98 = (context->query_radius).field_0.m128[2];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1008 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_1008 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar14 = true;
  }
LAB_0192f597:
  auVar25._0_4_ = auVar27._0_4_ * auVar27._0_4_;
  auVar25._4_4_ = auVar27._4_4_ * auVar27._4_4_;
  auVar25._8_4_ = auVar27._8_4_ * auVar27._8_4_;
  auVar25._12_4_ = auVar27._12_4_ * auVar27._12_4_;
  if (pauVar21 == (undefined1 (*) [16])&local_f78) {
    return bVar14;
  }
  goto LAB_0192efd1;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }